

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O2

FieldTuple * __thiscall
njoy::ENDFtk::record::
Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
::readFields<_1,0,1,2,3,4,5,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (FieldTuple *__return_storage_ptr__,
          Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
          *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *it)

{
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
       = (_Head_base<5UL,_long,_false>)0x0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  tools::disco::
  Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::RetainCarriage>
  ::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,double,double,long,long,long,long>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,
             &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
              super__Head_base<0UL,_double,_false>._M_head_impl,
             &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Head_base<1UL,_double,_false>._M_head_impl,
             &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
              _M_head_impl,
             &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl,
             &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>).
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Head_base<4UL,_long,_false>._M_head_impl,(long *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static FieldTuple
    readFields( Iterator& it, const Iterator& end, std::false_type ){
      FieldTuple result;
      Format::read( it, end, std::get< Indices >( result )... );
      return result;
    }